

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>
chaiscript::dispatch::detail::
call_func<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&,0ul>
          (element_type *param_1,
          _func_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
          **param_2,Function_Params *param_3,Function_Params *param_4,
          Type_Conversions_State *param_5)

{
  Boxed_Value *pBVar1;
  Boxed_Value *bv;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> sVar2;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> local_48;
  Type_Conversions_State *local_38;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
  **f_local;
  _func_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
  *param_0_local;
  element_type *local_10;
  
  pBVar1 = param_3->m_begin;
  local_38 = param_5;
  t_conversions_local = (Type_Conversions_State *)param_4;
  params_local = param_3;
  f_local = param_2;
  local_10 = param_1;
  bv = Function_Params::operator[](param_4,0);
  sVar2 = boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
                    ((chaiscript *)&local_48,bv,local_38);
  (*(code *)pBVar1)(param_1,(chaiscript *)&local_48,
                    sVar2.
                    super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi._M_pi);
  std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_48);
  sVar2.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = param_1;
  return (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>)
         sVar2.
         super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }